

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::MaterialBinding::set_materialBinding
          (MaterialBinding *this,Relationship *rel,token *mat_purpose)

{
  bool bVar1;
  ulong uVar2;
  string *psVar3;
  mapped_type *this_00;
  token *mat_purpose_local;
  Relationship *rel_local;
  MaterialBinding *this_local;
  
  Token::str_abi_cxx11_(mat_purpose);
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    psVar3 = Token::str_abi_cxx11_(mat_purpose);
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              psVar3,"full");
    if (bVar1) {
      set_materialBindingFull(this,rel);
    }
    else {
      psVar3 = Token::str_abi_cxx11_(mat_purpose);
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )psVar3,"preview");
      if (bVar1) {
        set_materialBindingFull(this,rel);
      }
      else {
        psVar3 = Token::str_abi_cxx11_(mat_purpose);
        this_00 = ::std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>_>_>
                  ::operator[](&this->_materialBindingMap,psVar3);
        Relationship::operator=(this_00,rel);
      }
    }
  }
  else {
    set_materialBinding(this,rel);
  }
  return;
}

Assistant:

void set_materialBinding(const Relationship &rel, const value::token &mat_purpose) {

    if (mat_purpose.str().empty()) {
      return set_materialBinding(rel);
    } else if (mat_purpose.str() == "full") {
      return set_materialBindingFull(rel);
    } else if (mat_purpose.str() == "preview") {
      return set_materialBindingFull(rel);
    } else {
      _materialBindingMap[mat_purpose.str()] = rel;
    }
  }